

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb_MergeNodeConforming(leb_Heap *leb,leb_Node node,leb_DiamondParent diamond)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  leb_Node node_00;
  
  node_00 = diamond.top;
  if (leb->minDepth != node.depth) {
    if (diamond.top.id != diamond.top.depth) {
      node_00 = (leb_Node)
                (((ulong)(diamond.top.id * 2) | (ulong)node_00 & 0xffffffff00000000) + 0x100000001);
    }
    uVar1 = leb__HeapRead(leb,(leb_Node)((ulong)node ^ 1));
    uVar2 = leb__HeapRead(leb,node_00);
    uVar4 = (ulong)(node_00.id != node_00.depth);
    uVar3 = leb__HeapRead(leb,(leb_Node)((ulong)node_00 ^ uVar4));
    if (((uVar1 == 1) && (uVar2 == 1)) && (uVar3 == 1)) {
      leb__HeapWrite_BitField(leb,(leb_Node)((ulong)(node.id != node.depth) | (ulong)node),0);
      leb__HeapWrite_BitField(leb,(leb_Node)((ulong)node_00 | uVar4),0);
      return;
    }
  }
  return;
}

Assistant:

LEBDEF void
leb_MergeNodeConforming(
    leb_Heap *leb,
    const leb_Node node,
    const leb_DiamondParent diamond
) {
    if (!leb_IsRootNode(leb, node)) {
        leb_Node dualNode = leb__RightChildNode(diamond.top);
        bool b1 = leb_IsLeafNode(leb, leb__SiblingNode_Fast(node));
        bool b2 = leb_IsLeafNode(leb, dualNode);
        bool b3 = leb_IsLeafNode(leb, leb__SiblingNode(dualNode));

        if (b1 && b2 && b3) {
            leb__MergeNode(leb, node);
            leb__MergeNode(leb, dualNode);
        }
    }
}